

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

int32_t inform_encode(int *state,size_t n,int b,inform_error *err)

{
  inform_error iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  
  if (state == (int *)0x0 || n == 0) {
    iVar1 = INFORM_EARG;
  }
  else if (b < 2) {
    iVar1 = INFORM_EBASE;
  }
  else {
    auVar6._8_4_ = (int)(n >> 0x20);
    auVar6._0_8_ = n;
    auVar6._12_4_ = 0x45300000;
    uVar4 = (uint)n;
    dVar5 = log2((double)b);
    if (dVar5 * ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar4) - 4503599627370496.0)) <= 31.0) {
      if ((int)uVar4 < 1) {
        return 0;
      }
      uVar3 = 0;
      iVar2 = 0;
      while (state[uVar3] < b) {
        iVar2 = iVar2 * b + state[uVar3];
        uVar3 = uVar3 + 1;
        if ((uVar4 & 0x7fffffff) == uVar3) {
          return iVar2;
        }
      }
    }
    iVar1 = INFORM_EENCODE;
  }
  if (err != (inform_error *)0x0) {
    *err = iVar1;
  }
  return -1;
}

Assistant:

int32_t inform_encode(int const *state, size_t n, int b, inform_error *err)
{
    if (state == NULL || n == 0)
        INFORM_ERROR_RETURN(err, INFORM_EARG, -1);
    else if (b < 2)
        INFORM_ERROR_RETURN(err, INFORM_EBASE, -1);
    else if (n * log2(b) > 31)
        INFORM_ERROR_RETURN(err, INFORM_EENCODE, -1);

    int32_t encoding = 0;
    for (int32_t i = 0; i < (int32_t) n; ++i)
    {
        if (b <= state[i])
            INFORM_ERROR_RETURN(err, INFORM_EENCODE, -1);
        encoding *= b;
        encoding += state[i];
    }
    return encoding;
}